

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

xmlParserInputBufferPtr xmlAllocParserInputBuffer(xmlCharEncoding enc)

{
  xmlParserErrors xVar1;
  xmlParserInputBufferPtr in;
  xmlBufPtr pxVar2;
  
  in = (xmlParserInputBufferPtr)(*xmlMalloc)(0x40);
  if (in != (xmlParserInputBufferPtr)0x0) {
    in->compressed = 0;
    in->error = 0;
    in->rawconsumed = 0;
    in->buffer = (xmlBufPtr)0x0;
    in->raw = (xmlBufPtr)0x0;
    in->closecallback = (xmlInputCloseCallback)0x0;
    in->encoder = (xmlCharEncodingHandlerPtr)0x0;
    in->context = (void *)0x0;
    in->readcallback = (xmlInputReadCallback)0x0;
    pxVar2 = xmlBufCreate(6000);
    in->buffer = pxVar2;
    if (pxVar2 == (xmlBufPtr)0x0) {
      (*xmlFree)(in);
    }
    else {
      if ((enc == XML_CHAR_ENCODING_NONE) ||
         (xVar1 = xmlLookupCharEncodingHandler(enc,&in->encoder), xVar1 == XML_ERR_OK)) {
        if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
          pxVar2 = (xmlBufPtr)0x0;
        }
        else {
          pxVar2 = xmlBufCreate(6000);
        }
        in->raw = pxVar2;
        in->context = (void *)0x0;
        in->readcallback = (xmlInputReadCallback)0x0;
        in->closecallback = (xmlInputCloseCallback)0x0;
        in->compressed = -1;
        in->rawconsumed = 0;
        return in;
      }
      xmlFreeParserInputBuffer(in);
    }
  }
  return (xmlParserInputBufferPtr)0x0;
}

Assistant:

xmlParserInputBufferPtr
xmlAllocParserInputBuffer(xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    ret = (xmlParserInputBufferPtr) xmlMalloc(sizeof(xmlParserInputBuffer));
    if (ret == NULL) {
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlParserInputBuffer));
    ret->buffer = xmlBufCreate(XML_IO_BUFFER_SIZE);
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }
    if (enc != XML_CHAR_ENCODING_NONE) {
        if (xmlLookupCharEncodingHandler(enc, &ret->encoder) != XML_ERR_OK) {
            /* We can't handle errors properly here. */
            xmlFreeParserInputBuffer(ret);
            return(NULL);
        }
    }
    if (ret->encoder != NULL)
        ret->raw = xmlBufCreate(XML_IO_BUFFER_SIZE);
    else
        ret->raw = NULL;
    ret->readcallback = NULL;
    ret->closecallback = NULL;
    ret->context = NULL;
    ret->compressed = -1;
    ret->rawconsumed = 0;

    return(ret);
}